

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::genBuiltInSource_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ShaderType shaderType)

{
  ostringstream *this_00;
  ostream *poVar1;
  char *pcVar2;
  ostringstream source;
  ostream local_190;
  
  this_00 = (ostringstream *)&local_190;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"${GLSL_VERSION_STRING}\n");
  switch((int)this) {
  case 2:
    this_00 = (ostringstream *)std::operator<<(&local_190,"layout(points) in;\n");
    pcVar2 = "layout(line_strip, max_vertices = 3) out;\n";
    break;
  case 3:
    this_00 = (ostringstream *)std::operator<<(&local_190,"${GLSL_TESS_EXTENSION_STRING}\n");
    pcVar2 = "layout(vertices = 10) out;\n";
    break;
  case 4:
    this_00 = (ostringstream *)std::operator<<(&local_190,"${GLSL_TESS_EXTENSION_STRING}\n");
    pcVar2 = "layout(triangles) in;\n";
    break;
  case 5:
    pcVar2 = "layout (local_size_x = 1) in;\n";
    break;
  default:
    goto switchD_013b6a60_default;
  }
  std::operator<<((ostream *)this_00,pcVar2);
switchD_013b6a60_default:
  poVar1 = std::operator<<(&local_190,"\n");
  poVar1 = std::operator<<(poVar1,"void main(void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"${COMPUTE_BUILT_IN_CONSTANTS_STRING}");
  std::operator<<(poVar1,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

string genBuiltInSource (glu::ShaderType shaderType)
{
	std::ostringstream		source;
	source << "${GLSL_VERSION_STRING}\n";

	switch (shaderType)
	{
		case glu::SHADERTYPE_VERTEX:
		case glu::SHADERTYPE_FRAGMENT:
			break;

		case glu::SHADERTYPE_COMPUTE:
			source << "layout (local_size_x = 1) in;\n";
			break;

		case glu::SHADERTYPE_GEOMETRY:
			source << "layout(points) in;\n"
				   << "layout(line_strip, max_vertices = 3) out;\n";
			break;

		case glu::SHADERTYPE_TESSELLATION_CONTROL:
			source << "${GLSL_TESS_EXTENSION_STRING}\n"
				   << "layout(vertices = 10) out;\n";
			break;

		case glu::SHADERTYPE_TESSELLATION_EVALUATION:
			source << "${GLSL_TESS_EXTENSION_STRING}\n"
				   << "layout(triangles) in;\n";
			break;

		default:
			DE_FATAL("Unknown shader type");
			break;
	}

	source	<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "${COMPUTE_BUILT_IN_CONSTANTS_STRING}"
			<< "}\n";

	return source.str();
}